

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  int iVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  int sizes [17];
  int next_code [16];
  int local_b8 [20];
  int aiStack_68 [16];
  
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_b8[0x10] = 0;
  memset(z,0,0x400);
  if (0 < num) {
    uVar5 = 0;
    do {
      local_b8[sizelist[uVar5]] = local_b8[sizelist[uVar5]] + 1;
      uVar5 = uVar5 + 1;
    } while ((uint)num != uVar5);
  }
  lVar6 = 1;
  pcVar8 = "bad sizes";
  do {
    if (1 << ((byte)lVar6 & 0x1f) < local_b8[lVar6]) goto LAB_00114bb8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  lVar6 = 0;
  bVar2 = 0xf;
  pcVar8 = "bad codelengths";
  iVar9 = 0;
  iVar10 = 0;
  while( true ) {
    aiStack_68[lVar6 + 1] = iVar10;
    z->firstcode[lVar6 + 1] = (stbi__uint16)iVar10;
    z->firstsymbol[lVar6 + 1] = (stbi__uint16)iVar9;
    iVar1 = local_b8[lVar6 + 1];
    iVar10 = iVar10 + iVar1;
    if ((iVar1 != 0) && (1 << ((char)lVar6 + 1U & 0x1f) < iVar10)) break;
    z->maxcode[lVar6 + 1] = iVar10 << (bVar2 & 0x1f);
    iVar10 = iVar10 * 2;
    iVar9 = iVar9 + iVar1;
    bVar2 = bVar2 - 1;
    lVar6 = lVar6 + 1;
    if (lVar6 == 0xf) {
      z->maxcode[0x10] = 0x10000;
      if (0 < num) {
        uVar5 = 0;
        do {
          bVar2 = sizelist[uVar5];
          if (bVar2 != 0) {
            iVar10 = aiStack_68[bVar2];
            lVar6 = (long)(int)(iVar10 - (uint)z->firstcode[bVar2]) + (ulong)z->firstsymbol[bVar2];
            z->size[lVar6] = bVar2;
            z->value[lVar6] = (ushort)uVar5;
            if ((bVar2 < 10) &&
               (uVar3 = (ushort)iVar10 << 8 | (ushort)iVar10 >> 8,
               uVar4 = (uVar3 & 0xf0f) << 4 | (uVar3 & 0xf0f0) >> 4,
               uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333) * 4,
               uVar4 = (uVar4 >> 1 & 0x5555) + (uVar4 & 0x5555) * 2 >> (0x10 - bVar2 & 0x1f),
               uVar4 < 0x200)) {
              uVar7 = (ulong)uVar4;
              do {
                z->fast[uVar7] = (ushort)uVar5 | (ushort)bVar2 << 9;
                uVar7 = uVar7 + (1L << (bVar2 & 0x3f));
              } while (uVar7 < 0x200);
            }
            aiStack_68[bVar2] = iVar10 + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)num);
      }
      return 1;
    }
  }
LAB_00114bb8:
  *(char **)(in_FS_OFFSET + -8) = pcVar8;
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}